

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_42f343::RSATest_CheckFIPS_Test::TestBody(RSATest_CheckFIPS_Test *this)

{
  bool bVar1;
  RSA *pRVar2;
  char *pcVar3;
  pointer prVar4;
  char *in_R9;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<RSA> pub;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<RSA> rsa;
  RSATest_CheckFIPS_Test *this_local;
  
  pRVar2 = RSA_private_key_from_bytes((anonymous_namespace)::kKey1,0x260);
  std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&gtest_ar_.message_,pRVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<rsa_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8b4dc8,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x229,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    prVar4 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_84 = RSA_check_fips(prVar4);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_80,&local_84,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&pub,(internal *)local_80,(AssertionResult *)"RSA_check_fips(rsa.get())",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
                 ,0x22a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&pub);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    pRVar2 = RSA_public_key_from_bytes((anonymous_namespace)::kKey1Public,0x8c);
    std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,pRVar2);
    testing::AssertionResult::AssertionResult<std::unique_ptr<rsa_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_d0,
               (unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_d0,(AssertionResult *)"pub",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
                 ,0x22f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_d8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      prVar4 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
      local_114 = RSA_check_fips(prVar4);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_110,&local_114,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_110,(AssertionResult *)"RSA_check_fips(pub.get())",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
                   ,0x230,pcVar3);
        testing::internal::AssertHelper::operator=(&local_128,&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        testing::Message::~Message(&local_120);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
    std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(RSATest, CheckFIPS) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey1, sizeof(kKey1)));
  ASSERT_TRUE(rsa);
  EXPECT_TRUE(RSA_check_fips(rsa.get()));

  // Check that RSA_check_fips works on a public key.
  bssl::UniquePtr<RSA> pub(
      RSA_public_key_from_bytes(kKey1Public, sizeof(kKey1Public)));
  ASSERT_TRUE(pub);
  EXPECT_TRUE(RSA_check_fips(pub.get()));
}